

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *positionalMode,bool *spacePadPositive,int *ntrunc,
                 char *fmtStart,FormatArg *args,int *argIndex,int numArgs)

{
  byte bVar1;
  ostream oVar2;
  bool bVar3;
  long lVar4;
  runtime_error *prVar5;
  uint uVar6;
  ostream *poVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  int width;
  byte *local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*fmtStart != '%') {
    __assert_fail("*fmtStart == \'%\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/tinyformat.h"
                  ,0x29a,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  lVar10 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar10 + -0x18) + 0x10) = 0;
  *(undefined8 *)(out + *(long *)(lVar10 + -0x18) + 8) = 6;
  poVar7 = out + *(long *)(lVar10 + -0x18);
  if (out[*(long *)(lVar10 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar7);
    poVar7[0xe0] = oVar2;
    poVar7[0xe1] = (ostream)0x1;
  }
  poVar7[0xe0] = (ostream)0x20;
  lVar10 = *(long *)out;
  *(uint *)(out + *(long *)(lVar10 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar10 + -0x18) + 0x18) & 0xffffb000;
  local_60 = (byte *)(fmtStart + 1);
  bVar1 = fmtStart[1];
  if ((byte)(bVar1 - 0x30) < 10) {
    iVar9 = 0;
    if ((byte)(bVar1 - 0x30) < 10) {
      iVar9 = 0;
      bVar8 = bVar1;
      do {
        iVar9 = (uint)(byte)(bVar8 - 0x30) + iVar9 * 10;
        bVar8 = local_60[1];
        local_60 = local_60 + 1;
      } while ((byte)(bVar8 - 0x30) < 10);
    }
    if (*local_60 == 0x24) {
      if ((iVar9 < 1) || (numArgs < iVar9)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"tinyformat: Positional argument out of range","");
        std::runtime_error::runtime_error(prVar5,(string *)local_58);
        *(undefined ***)prVar5 = &PTR__runtime_error_00b10098;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001700d8;
      }
      *argIndex = iVar9 + -1;
      local_60 = local_60 + 1;
      *positionalMode = true;
      goto LAB_0016f936;
    }
    if (*positionalMode == true) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "tinyformat: Non-positional argument used after a positional one","");
      std::runtime_error::runtime_error(prVar5,(string *)local_58);
      *(undefined ***)prVar5 = &PTR__runtime_error_00b10098;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001700d8;
    }
    if (bVar1 == 0x30) {
      lVar10 = *(long *)(lVar10 + -0x18);
      poVar7 = out + lVar10;
      if (out[lVar10 + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar7);
        poVar7[0xe0] = oVar2;
        poVar7[0xe1] = (ostream)0x1;
      }
      poVar7[0xe0] = (ostream)0x30;
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffff4f | 0x10;
    }
    if (iVar9 == 0) goto LAB_0016f936;
    *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = (long)iVar9;
    bVar3 = true;
  }
  else {
    if (*positionalMode == true) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "tinyformat: Non-positional argument used after a positional one","");
      std::runtime_error::runtime_error(prVar5,(string *)local_58);
      *(undefined ***)prVar5 = &PTR__runtime_error_00b10098;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001700d8;
    }
LAB_0016f936:
    bVar3 = false;
  }
  lVar10 = 0;
  if (bVar3 == false) {
    do {
      bVar1 = *local_60;
      if (bVar1 < 0x2b) {
        if (bVar1 == 0x20) {
          if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x19] & 8) == 0) {
            *spacePadPositive = true;
          }
        }
        else {
          if (bVar1 != 0x23) goto LAB_0016fa6b;
          *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
               *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x600;
        }
      }
      else if (bVar1 == 0x2b) {
        *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x800;
        *spacePadPositive = false;
        lVar10 = 1;
      }
      else {
        if (bVar1 == 0x2d) {
          poVar7 = out + *(long *)(*(long *)out + -0x18);
          if (out[*(long *)(*(long *)out + -0x18) + 0xe1] == (ostream)0x0) {
            oVar2 = (ostream)std::ios::widen((char)poVar7);
            poVar7[0xe0] = oVar2;
            poVar7[0xe1] = (ostream)0x1;
          }
          poVar7[0xe0] = (ostream)0x20;
          lVar4 = *(long *)(*(long *)out + -0x18);
          uVar6 = *(uint *)(out + lVar4 + 0x18) & 0xffffff4f | 0x20;
        }
        else {
          if (bVar1 != 0x30) goto LAB_0016fa6b;
          if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x18] & 0x20) != 0) goto LAB_0016fa61;
          poVar7 = out + *(long *)(*(long *)out + -0x18);
          if (poVar7[0xe1] == (ostream)0x0) {
            oVar2 = (ostream)std::ios::widen((char)poVar7);
            poVar7[0xe0] = oVar2;
            poVar7[0xe1] = (ostream)0x1;
          }
          poVar7[0xe0] = (ostream)0x30;
          lVar4 = *(long *)(*(long *)out + -0x18);
          uVar6 = *(uint *)(out + lVar4 + 0x18) & 0xffffff4f | 0x10;
        }
        *(uint *)(out + lVar4 + 0x18) = uVar6;
      }
LAB_0016fa61:
      local_60 = local_60 + 1;
    } while( true );
  }
LAB_0016fb16:
  if (*local_60 == 0x2e) {
    local_60 = local_60 + 1;
    local_58[0] = (undefined1 *)((ulong)local_58[0] & 0xffffffff00000000);
    parseWidthOrPrecision((int *)local_58,(char **)&local_60,*positionalMode,args,argIndex,numArgs);
    bVar11 = -1 < (long)(int)local_58[0];
    if (bVar11) {
      *(long *)(out + *(long *)(*(long *)out + -0x18) + 8) = (long)(int)local_58[0];
    }
  }
  else {
    bVar11 = false;
  }
LAB_0016fb85:
  bVar1 = *local_60;
  uVar6 = 8;
  switch(bVar1) {
  case 0x45:
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x4000;
  case 0x65:
    lVar10 = *(long *)out;
    lVar4 = *(long *)(lVar10 + -0x18);
    *(uint *)(out + lVar4 + 0x18) = *(uint *)(out + lVar4 + 0x18) & 0xfffffefb | 0x100;
    lVar10 = *(long *)(lVar10 + -0x18);
    uVar6 = *(uint *)(out + lVar10 + 0x18) & 0xffffffb5 | 2;
LAB_0016fd7f:
    *(uint *)(out + lVar10 + 0x18) = uVar6;
    goto switchD_0016fba1_caseD_48;
  case 0x46:
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x4000;
  case 0x66:
    lVar10 = *(long *)(*(long *)out + -0x18);
    uVar6 = *(uint *)(out + lVar10 + 0x18) & 0xfffffefb | 4;
    goto LAB_0016fd7f;
  case 0x47:
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x4000;
  case 0x67:
    lVar10 = *(long *)out;
    lVar4 = *(long *)(lVar10 + -0x18);
    *(uint *)(out + lVar4 + 0x18) = *(uint *)(out + lVar4 + 0x18) & 0xffffffb5 | 2;
    *(uint *)(out + *(long *)(lVar10 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar10 + -0x18) + 0x18) & 0xfffffefb;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 99:
  case 0x6b:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x76:
  case 0x77:
  case 0x79:
    goto switchD_0016fba1_caseD_48;
  case 0x4c:
  case 0x68:
  case 0x6a:
  case 0x6c:
  case 0x74:
  case 0x7a:
    goto switchD_0016fba1_caseD_4c;
  case 0x58:
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x4000;
    break;
  case 0x61:
    goto switchD_0016fba1_caseD_61;
  case 100:
  case 0x69:
  case 0x75:
    uVar6 = 2;
    break;
  case 0x6e:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"tinyformat: %n conversion spec not supported","");
    std::runtime_error::runtime_error(prVar5,(string *)local_58);
    *(undefined ***)prVar5 = &PTR__runtime_error_00b10098;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_001700d8;
  case 0x6f:
    uVar6 = 0x40;
    break;
  case 0x70:
  case 0x78:
    break;
  case 0x73:
    if (bVar11) {
      *ntrunc = *(int *)(out + *(long *)(*(long *)out + -0x18) + 8);
    }
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 1;
    goto switchD_0016fba1_caseD_48;
  default:
    if (bVar1 != 0x41) {
      if (bVar1 != 0) goto switchD_0016fba1_caseD_48;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "tinyformat: Conversion spec incorrectly terminated by end of string","");
      std::runtime_error::runtime_error(prVar5,(string *)local_58);
      *(undefined ***)prVar5 = &PTR__runtime_error_00b10098;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar5,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001700d8;
    }
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x4000;
switchD_0016fba1_caseD_61:
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) | 0x104;
    goto switchD_0016fba1_caseD_48;
  }
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | uVar6;
  if ((bVar11) && (bVar3 == false)) {
    lVar4 = *(long *)out;
    *(long *)(out + *(long *)(lVar4 + -0x18) + 0x10) =
         lVar10 + *(long *)(out + *(long *)(lVar4 + -0x18) + 8);
    *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar4 + -0x18) + 0x18) & 0xffffff4f | 0x10;
    poVar7 = out + *(long *)(lVar4 + -0x18);
    if (out[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar2 = (ostream)std::ios::widen((char)poVar7);
      poVar7[0xe0] = oVar2;
      poVar7[0xe1] = (ostream)0x1;
    }
    poVar7[0xe0] = (ostream)0x30;
  }
  goto switchD_0016fba1_caseD_48;
LAB_0016fa6b:
  local_58[0] = (undefined1 *)((ulong)local_58[0] & 0xffffffff00000000);
  bVar3 = parseWidthOrPrecision
                    ((int *)local_58,(char **)&local_60,*positionalMode,args,argIndex,numArgs);
  if (bVar3) {
    if ((int)local_58[0] < 0) {
      poVar7 = out + *(long *)(*(long *)out + -0x18);
      if (out[*(long *)(*(long *)out + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar7);
        poVar7[0xe0] = oVar2;
        poVar7[0xe1] = (ostream)0x1;
      }
      poVar7[0xe0] = (ostream)0x20;
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffff4f | 0x20;
      local_58[0] = (undefined1 *)CONCAT44(local_58[0]._4_4_,-(int)local_58[0]);
    }
    *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = (long)(int)local_58[0];
  }
  goto LAB_0016fb16;
switchD_0016fba1_caseD_4c:
  local_60 = local_60 + 1;
  goto LAB_0016fb85;
switchD_0016fba1_caseD_48:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (char *)(local_60 + 1);
  }
LAB_001700d8:
  __stack_chk_fail();
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& positionalMode,
                                         bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* args,
                                         int& argIndex, int numArgs)
{
    TINYFORMAT_ASSERT(*fmtStart == '%');
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;

    // 1) Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag.
    if (*c >= '0' && *c <= '9') {
        const char tmpc = *c;
        int value = parseIntAndAdvance(c);
        if (*c == '$') {
            // value is an argument index
            if (value > 0 && value <= numArgs)
                argIndex = value - 1;
            else
                TINYFORMAT_ERROR("tinyformat: Positional argument out of range");
            ++c;
            positionalMode = true;
        }
        else if (positionalMode) {
            TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
        }
        else {
            if (tmpc == '0') {
                // Use internal padding so that numeric values are
                // formatted correctly, eg -00010 rather than 000-10
                out.fill('0');
                out.setf(std::ios::internal, std::ios::adjustfield);
            }
            if (value != 0) {
                // Nonzero value means that we parsed width.
                widthSet = true;
                out.width(value);
            }
        }
    }
    else if (positionalMode) {
        TINYFORMAT_ERROR("tinyformat: Non-positional argument used after a positional one");
    }
    // 2) Parse flags and width if we did not do it in previous step.
    if (!widthSet) {
        // Parse flags
        for (;; ++c) {
            switch (*c) {
                case '#':
                    out.setf(std::ios::showpoint | std::ios::showbase);
                    continue;
                case '0':
                    // overridden by left alignment ('-' flag)
                    if (!(out.flags() & std::ios::left)) {
                        // Use internal padding so that numeric values are
                        // formatted correctly, eg -00010 rather than 000-10
                        out.fill('0');
                        out.setf(std::ios::internal, std::ios::adjustfield);
                    }
                    continue;
                case '-':
                    out.fill(' ');
                    out.setf(std::ios::left, std::ios::adjustfield);
                    continue;
                case ' ':
                    // overridden by show positive sign, '+' flag.
                    if (!(out.flags() & std::ios::showpos))
                        spacePadPositive = true;
                    continue;
                case '+':
                    out.setf(std::ios::showpos);
                    spacePadPositive = false;
                    widthExtra = 1;
                    continue;
                default:
                    break;
            }
            break;
        }
        // Parse width
        int width = 0;
        widthSet = parseWidthOrPrecision(width, c, positionalMode,
                                         args, argIndex, numArgs);
        if (widthSet) {
            if (width < 0) {
                // negative widths correspond to '-' flag set
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                width = -width;
            }
            out.width(width);
        }
    }
    // 3) Parse precision
    if (*c == '.') {
        ++c;
        int precision = 0;
        parseWidthOrPrecision(precision, c, positionalMode,
                              args, argIndex, numArgs);
        // Presence of `.` indicates precision set, unless the inferred value
        // was negative in which case the default is used.
        precisionSet = precision >= 0;
        if (precisionSet)
            out.precision(precision);
    }
    // 4) Ignore any C99 length modifier
    while (*c == 'l' || *c == 'h' || *c == 'L' ||
           *c == 'j' || *c == 'z' || *c == 't') {
        ++c;
    }
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch (*c) {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'A':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'a':
#           ifdef _MSC_VER
            // Workaround https://developercommunity.visualstudio.com/content/problem/520472/hexfloat-stream-output-does-not-ignore-precision-a.html
            // by always setting maximum precision on MSVC to avoid precision
            // loss for doubles.
            out.precision(13);
#           endif
            out.setf(std::ios::fixed | std::ios::scientific, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]];
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if (precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print Booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if (intConversion && precisionSet && !widthSet) {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}